

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O1

qpdf_stream_decode_level_e __thiscall
qpdf::Stream::writeStreamJSON
          (Stream *this,int json_version,Writer *jw,qpdf_json_stream_data_e json_data,
          qpdf_stream_decode_level_e decode_level,Pipeline *p,string *data_filename,bool no_data_key
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  qpdf_json_stream_data_e qVar4;
  Writer *this_00;
  bool bVar5;
  logic_error *plVar6;
  Writer *pWVar7;
  int iVar8;
  Pl_Buffer *pipeline;
  bool bVar9;
  bool bVar10;
  string_view sv;
  QPDFObjectHandle dict;
  Pl_Buffer buf_pl;
  Pl_Discard discard;
  bool local_10d;
  qpdf_stream_decode_level_e local_10c;
  string local_108;
  qpdf_json_stream_data_e local_e8;
  int local_e4;
  QPDFObjectHandle local_e0;
  Members *local_d0;
  Pipeline *local_c8;
  Writer *local_c0;
  Pl_Buffer local_b8;
  string local_80;
  Pl_Discard local_60;
  
  local_10c = decode_level;
  local_d0 = stream(this);
  if (json_data < qpdf_sj_file) {
    if (p != (Pipeline *)0x0) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar6,
                 "QPDF_Stream::writeStreamJSON: pipeline should only be supplied when json_data is file"
                );
      goto LAB_001ffa3c;
    }
  }
  else if (json_data == qpdf_sj_file) {
    if (p == (Pipeline *)0x0) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar6,
                 "QPDF_Stream::writeStreamJSON: pipeline must be supplied when json_data is file");
LAB_001ffa3c:
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (data_filename->_M_string_length == 0) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar6,
                 "QPDF_Stream::writeStreamJSON: data_filename must be supplied when json_data is file"
                );
      goto LAB_001ffa3c;
    }
  }
  local_b8.super_Pipeline._vptr_Pipeline._0_1_ = 0x7b;
  (*jw->p->_vptr_Pipeline[2])(jw->p,&local_b8,1);
  jw->first = true;
  jw->indent = jw->indent + 2;
  if (json_data == qpdf_sj_none) {
    JSON::Writer::writeNext(jw);
    (*jw->p->_vptr_Pipeline[2])(jw->p,"\"dict\": ",8);
    QPDFObjectHandle::writeJSON(&local_d0->stream_dict,json_version,jw,false);
    local_b8.super_Pipeline._vptr_Pipeline._0_1_ = 0x7d;
    JSON::Writer::writeEnd(jw,(char *)&local_b8);
    return local_10c;
  }
  local_e4 = json_version;
  local_c8 = p;
  local_c0 = jw;
  Pl_Discard::Pl_Discard(&local_60);
  Pl_Buffer::Pl_Buffer(&local_b8,"stream data",(Pipeline *)0x0);
  pipeline = (Pl_Buffer *)&local_60;
  if (!no_data_key) {
    pipeline = &local_b8;
  }
  if (json_data != qpdf_sj_inline) {
    pipeline = &local_b8;
  }
  local_10d = false;
  bVar10 = local_10c != qpdf_dl_none;
  iVar8 = 1;
  local_e8 = json_data;
  bVar3 = false;
  do {
    bVar5 = pipeStreamData(this,&pipeline->super_Pipeline,&local_10d,0,local_10c,false,iVar8 == 1);
    if (bVar5) {
      bVar5 = true;
      if (bVar10) {
        bVar2 = true;
        if (local_10d == false) goto LAB_001ff655;
      }
      else {
        bVar2 = true;
      }
    }
    else {
LAB_001ff655:
      Pl_Buffer::getString_abi_cxx11_(&local_80,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      bVar10 = false;
      bVar2 = false;
      local_10c = qpdf_dl_none;
      bVar5 = bVar3;
    }
    bVar9 = iVar8 != 0;
    iVar8 = iVar8 + -1;
  } while ((!bVar2) && (bVar3 = bVar5, bVar9));
  if (!bVar5) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"QPDF_Stream: failed to get stream data");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  QPDFObjectHandle::unsafeShallowCopy(&local_e0);
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"/Length","");
  QPDFObjectHandle::removeKey(&local_e0,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  this_00 = local_c0;
  iVar8 = local_e4;
  qVar4 = local_e8;
  if ((bVar10) && (local_10d == true)) {
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"/Filter","");
    QPDFObjectHandle::removeKey(&local_e0,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"/DecodeParms","");
    QPDFObjectHandle::removeKey(&local_e0,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  if (qVar4 == qpdf_sj_file) {
    pWVar7 = JSON::Writer::writeNext(this_00);
    (*pWVar7->p->_vptr_Pipeline[2])(pWVar7->p,"\"datafile\": \"",0xd);
    JSON::Writer::encode_string(&local_108,data_filename);
    (*pWVar7->p->_vptr_Pipeline[2])(pWVar7->p,local_108._M_dataplus._M_p,local_108._M_string_length)
    ;
    (*pWVar7->p->_vptr_Pipeline[2])(pWVar7->p,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    Pl_Buffer::getString_abi_cxx11_(&local_108,&local_b8);
    Pipeline::writeString(local_c8,&local_108);
  }
  else {
    if (qVar4 != qpdf_sj_inline) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar6,"QPDF_Stream::writeStreamJSON : unexpected value of json_data");
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (no_data_key) goto LAB_001ff922;
    pWVar7 = JSON::Writer::writeNext(this_00);
    (*pWVar7->p->_vptr_Pipeline[2])(pWVar7->p,"\"data\": \"",9);
    Pl_Buffer::getString_abi_cxx11_(&local_108,&local_b8);
    sv._M_str = local_108._M_dataplus._M_p;
    sv._M_len = local_108._M_string_length;
    pWVar7 = JSON::Writer::writeBase64(this_00,sv);
    (*pWVar7->p->_vptr_Pipeline[2])(pWVar7->p,"\"",1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
LAB_001ff922:
  pWVar7 = JSON::Writer::writeNext(this_00);
  (*pWVar7->p->_vptr_Pipeline[2])(pWVar7->p,"\"dict\": ",8);
  QPDFObjectHandle::writeJSON(&local_e0,iVar8,this_00,false);
  local_108._M_dataplus._M_p._0_1_ = 0x7d;
  JSON::Writer::writeEnd(this_00,(char *)&local_108);
  if (local_e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  Pl_Buffer::~Pl_Buffer(&local_b8);
  Pl_Discard::~Pl_Discard(&local_60);
  return local_10c;
}

Assistant:

qpdf_stream_decode_level_e
Stream::writeStreamJSON(
    int json_version,
    JSON::Writer& jw,
    qpdf_json_stream_data_e json_data,
    qpdf_stream_decode_level_e decode_level,
    Pipeline* p,
    std::string const& data_filename,
    bool no_data_key)
{
    auto s = stream();
    switch (json_data) {
    case qpdf_sj_none:
    case qpdf_sj_inline:
        if (p != nullptr) {
            throw std::logic_error(
                "QPDF_Stream::writeStreamJSON: pipeline should only be supplied "
                "when json_data is file");
        }
        break;
    case qpdf_sj_file:
        if (p == nullptr) {
            throw std::logic_error(
                "QPDF_Stream::writeStreamJSON: pipeline must be supplied when json_data is file");
        }
        if (data_filename.empty()) {
            throw std::logic_error(
                "QPDF_Stream::writeStreamJSON: data_filename must be supplied "
                "when json_data is file");
        }
        break;
    }

    jw.writeStart('{');

    if (json_data == qpdf_sj_none) {
        jw.writeNext();
        jw << R"("dict": )";
        s->stream_dict.writeJSON(json_version, jw);
        jw.writeEnd('}');
        return decode_level;
    }

    Pl_Discard discard;
    Pl_Buffer buf_pl{"stream data"};
    Pipeline* data_pipeline = &buf_pl;
    if (no_data_key && json_data == qpdf_sj_inline) {
        data_pipeline = &discard;
    }
    // pipeStreamData produced valid data.
    bool buf_pl_ready = false;
    bool filtered = false;
    bool filter = (decode_level != qpdf_dl_none);
    for (int attempt = 1; attempt <= 2; ++attempt) {
        bool succeeded =
            pipeStreamData(data_pipeline, &filtered, 0, decode_level, false, (attempt == 1));
        if (!succeeded || (filter && !filtered)) {
            // Try again
            filter = false;
            decode_level = qpdf_dl_none;
            buf_pl.getString(); // reset buf_pl
        } else {
            buf_pl_ready = true;
            break;
        }
    }
    if (!buf_pl_ready) {
        throw std::logic_error("QPDF_Stream: failed to get stream data");
    }
    // We can use unsafeShallowCopy because we are only touching top-level keys.
    auto dict = s->stream_dict.unsafeShallowCopy();
    dict.removeKey("/Length");
    if (filter && filtered) {
        dict.removeKey("/Filter");
        dict.removeKey("/DecodeParms");
    }
    if (json_data == qpdf_sj_file) {
        jw.writeNext() << R"("datafile": ")" << JSON::Writer::encode_string(data_filename) << "\"";
        p->writeString(buf_pl.getString());
    } else if (json_data == qpdf_sj_inline) {
        if (!no_data_key) {
            jw.writeNext() << R"("data": ")";
            jw.writeBase64(buf_pl.getString()) << "\"";
        }
    } else {
        throw std::logic_error("QPDF_Stream::writeStreamJSON : unexpected value of json_data");
    }

    jw.writeNext() << R"("dict": )";
    dict.writeJSON(json_version, jw);
    jw.writeEnd('}');

    return decode_level;
}